

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

int png_cache_unknown_chunk(png_structrp png_ptr,png_uint_32 length)

{
  png_uint_32 pVar1;
  png_bytep buf;
  ulong size;
  int iVar2;
  ulong uVar3;
  png_byte *ppVar4;
  
  size = (ulong)length;
  ppVar4 = (png_ptr->unknown_chunk).data;
  if (ppVar4 != (png_byte *)0x0) {
    png_free(png_ptr,ppVar4);
    (png_ptr->unknown_chunk).data = (png_byte *)0x0;
  }
  uVar3 = 0xffffffffffffffff;
  if (1 < png_ptr->user_chunk_malloc_max + 1) {
    uVar3 = png_ptr->user_chunk_malloc_max;
  }
  if (size <= uVar3) {
    pVar1 = png_ptr->chunk_name;
    (png_ptr->unknown_chunk).name[0] = (png_byte)(pVar1 >> 0x18);
    (png_ptr->unknown_chunk).name[1] = (png_byte)(pVar1 >> 0x10);
    (png_ptr->unknown_chunk).name[2] = (png_byte)(pVar1 >> 8);
    (png_ptr->unknown_chunk).name[3] = (png_byte)pVar1;
    (png_ptr->unknown_chunk).name[4] = '\0';
    (png_ptr->unknown_chunk).size = size;
    (png_ptr->unknown_chunk).location = (png_byte)png_ptr->mode;
    if (length == 0) {
      ppVar4 = (png_byte *)0x0;
    }
    else {
      ppVar4 = (png_byte *)png_malloc_warn(png_ptr,size);
    }
    (png_ptr->unknown_chunk).data = ppVar4;
  }
  buf = (png_ptr->unknown_chunk).data;
  if (length == 0 || buf != (png_bytep)0x0) {
    if (length != 0) {
      png_crc_read(png_ptr,buf,length);
    }
    png_crc_finish(png_ptr,0);
    iVar2 = 1;
  }
  else {
    png_crc_finish(png_ptr,length);
    png_chunk_benign_error(png_ptr,"unknown chunk exceeds memory limits");
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
png_cache_unknown_chunk(png_structrp png_ptr, png_uint_32 length)
{
   png_alloc_size_t limit = PNG_SIZE_MAX;

   if (png_ptr->unknown_chunk.data != NULL)
   {
      png_free(png_ptr, png_ptr->unknown_chunk.data);
      png_ptr->unknown_chunk.data = NULL;
   }

#  ifdef PNG_SET_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_malloc_max > 0 &&
       png_ptr->user_chunk_malloc_max < limit)
      limit = png_ptr->user_chunk_malloc_max;

#  elif PNG_USER_CHUNK_MALLOC_MAX > 0
   if (PNG_USER_CHUNK_MALLOC_MAX < limit)
      limit = PNG_USER_CHUNK_MALLOC_MAX;
#  endif

   if (length <= limit)
   {
      PNG_CSTRING_FROM_CHUNK(png_ptr->unknown_chunk.name, png_ptr->chunk_name);
      /* The following is safe because of the PNG_SIZE_MAX init above */
      png_ptr->unknown_chunk.size = (png_size_t)length/*SAFE*/;
      /* 'mode' is a flag array, only the bottom four bits matter here */
      png_ptr->unknown_chunk.location = (png_byte)png_ptr->mode/*SAFE*/;

      if (length == 0)
         png_ptr->unknown_chunk.data = NULL;

      else
      {
         /* Do a 'warn' here - it is handled below. */
         png_ptr->unknown_chunk.data = png_voidcast(png_bytep,
             png_malloc_warn(png_ptr, length));
      }
   }

   if (png_ptr->unknown_chunk.data == NULL && length > 0)
   {
      /* This is benign because we clean up correctly */
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "unknown chunk exceeds memory limits");
      return 0;
   }

   else
   {
      if (length > 0)
         png_crc_read(png_ptr, png_ptr->unknown_chunk.data, length);
      png_crc_finish(png_ptr, 0);
      return 1;
   }
}